

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<char>::resize(ImVector<char> *this,int new_size,char *v)

{
  long lVar1;
  int iVar2;
  
  iVar2 = this->Capacity;
  if (iVar2 < new_size) {
    if (iVar2 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar2 / 2 + iVar2;
    }
    if (iVar2 <= new_size) {
      iVar2 = new_size;
    }
    reserve(this,iVar2);
  }
  lVar1 = (long)this->Size;
  if (this->Size < new_size) {
    for (; lVar1 < new_size; lVar1 = lVar1 + 1) {
      this->Data[lVar1] = *v;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }